

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O1

Var Js::JavascriptArray::SpreadArrayArgs
              (Var arrayToSpread,AuxArray<unsigned_int> *spreadIndices,ScriptContext *scriptContext)

{
  bool bVar1;
  uint end;
  List<void_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer> *pLVar2;
  code *pcVar3;
  bool bVar4;
  int iVar5;
  uint32 uVar6;
  BOOL BVar7;
  JavascriptCopyOnAccessNativeIntArray *this;
  JavascriptArray *srcArray;
  undefined4 extraout_var;
  Var pvVar8;
  JavascriptArray *this_00;
  undefined4 *puVar9;
  JavascriptArray *pJVar10;
  undefined4 extraout_var_00;
  SpreadArgument *pSVar11;
  WriteBarrierPtr<void> *pWVar12;
  uint uVar13;
  uint elementCount;
  ulong uVar14;
  undefined1 local_a8 [8];
  anon_class_16_2_4d2d011e slowCopy;
  ScriptContext *local_90;
  ScriptContext *scriptContext_local;
  anon_class_8_1_9014563a needArraySlowCopy;
  JsReentLock jsReentLock;
  uint local_4c;
  ScriptContext *local_48;
  uint local_34;
  
  needArraySlowCopy.jsReentLock = (JsReentLock *)scriptContext->threadContext;
  bVar1 = ((ThreadContext *)needArraySlowCopy.jsReentLock)->noJsReentrancy;
  ((ThreadContext *)needArraySlowCopy.jsReentLock)->noJsReentrancy = true;
  local_90 = scriptContext;
  JsReentLock::setObjectForMutation((JsReentLock *)&needArraySlowCopy,arrayToSpread);
  if (arrayToSpread != (Var)0x0) {
    bVar4 = VarIs<Js::JavascriptCopyOnAccessNativeIntArray>(arrayToSpread);
    if (bVar4) {
      this = UnsafeVarTo<Js::JavascriptCopyOnAccessNativeIntArray>(arrayToSpread);
    }
    else {
      this = (JavascriptCopyOnAccessNativeIntArray *)0x0;
    }
    if (this != (JavascriptCopyOnAccessNativeIntArray *)0x0) {
      JavascriptCopyOnAccessNativeIntArray::ConvertCopyOnAccessSegment(this);
    }
  }
  srcArray = VarTo<Js::JavascriptArray>(arrayToSpread);
  end = (srcArray->super_ArrayObject).length;
  elementCount = end;
  if (spreadIndices->count != 0) {
    uVar14 = 0;
    do {
      *(bool *)&needArraySlowCopy.jsReentLock[8].m_arrayObject = bVar1;
      iVar5 = (*(srcArray->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
                super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
                [0x72])(srcArray,(ulong)spreadIndices[uVar14 + 1].count);
      uVar6 = GetSpreadArgLen((Var)CONCAT44(extraout_var,iVar5),local_90);
      uVar13 = elementCount - 1;
      elementCount = uVar13 + uVar6;
      if (CARRY4(uVar13,uVar6)) {
        ::Math::DefaultOverflowPolicy();
      }
      JsReentLock::MutateArrayObject((JsReentLock *)&needArraySlowCopy);
      *(undefined1 *)&needArraySlowCopy.jsReentLock[8].m_arrayObject = 1;
      uVar14 = uVar14 + 1;
    } while (uVar14 < spreadIndices->count);
  }
  pvVar8 = OP_NewScArrayWithMissingValues(elementCount,local_90);
  this_00 = VarTo<Js::JavascriptArray>(pvVar8);
  if ((end != 0) && (elementCount != 0)) {
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    local_48 = (ScriptContext *)0x0;
    local_34 = 0;
    local_4c = 0;
    slowCopy.needArraySlowCopy = (anon_class_8_1_9014563a *)spreadIndices;
    do {
      uVar13 = *(uint *)((long)&((anon_class_8_1_9014563a *)spreadIndices)->jsReentLock +
                        (ulong)local_4c * 4 + 4);
      local_a8 = (undefined1  [8])&local_90;
      slowCopy.scriptContext = &scriptContext_local;
      scriptContext_local = (ScriptContext *)&needArraySlowCopy;
      if ((uint)local_48 < uVar13) {
        bVar4 = IsNonES5Array(srcArray);
        if (bVar4) {
          pJVar10 = UnsafeVarTo<Js::JavascriptArray>(srcArray);
        }
        else {
          pJVar10 = (JavascriptArray *)0x0;
        }
        if (pJVar10 == (JavascriptArray *)0x0) {
LAB_00b93707:
          *(bool *)&needArraySlowCopy.jsReentLock[8].m_arrayObject = bVar1;
          CopyAnyArrayElementsToVar<unsigned_int>(this_00,local_34,srcArray,(uint)local_48,uVar13);
          JsReentLock::MutateArrayObject((JsReentLock *)&needArraySlowCopy);
          *(undefined1 *)&needArraySlowCopy.jsReentLock[8].m_arrayObject = 1;
        }
        else {
          *(bool *)((scriptContext_local->super_ScriptContextInfo)._vptr_ScriptContextInfo + 0x21) =
               (scriptContext_local->super_ScriptContextBase).isClosed;
          iVar5 = (*(pJVar10->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
                    super_FinalizableObject.super_IRecyclerVisitedObject.
                    _vptr_IRecyclerVisitedObject[0x66])(pJVar10);
          if ((iVar5 == 0) && (bVar4 = IsFillFromPrototypes(pJVar10), !bVar4)) goto LAB_00b93707;
          SpreadArrayArgs::anon_class_16_2_4d2d011e::operator()
                    ((anon_class_16_2_4d2d011e *)local_a8,this_00,local_34,srcArray,(uint)local_48,
                     uVar13);
        }
        local_34 = (local_34 - (uint)local_48) + uVar13;
        iVar5 = 7;
        local_48 = (ScriptContext *)(ulong)(uVar13 - 1);
      }
      else if (uVar13 < (uint)local_48) {
        if (local_4c != *(uint32 *)&((anon_class_8_1_9014563a *)spreadIndices)->jsReentLock - 1) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar9 = 1;
          bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                      ,0x2dee,"(spreadArrIndex == spreadIndices->count - 1)",
                                      "spreadArrIndex == spreadIndices->count - 1");
          if (!bVar4) goto LAB_00b93973;
          *puVar9 = 0;
        }
        bVar4 = IsNonES5Array(srcArray);
        if (bVar4) {
          pJVar10 = UnsafeVarTo<Js::JavascriptArray>(srcArray);
        }
        else {
          pJVar10 = (JavascriptArray *)0x0;
        }
        if (pJVar10 != (JavascriptArray *)0x0) {
          *(bool *)((scriptContext_local->super_ScriptContextInfo)._vptr_ScriptContextInfo + 0x21) =
               (scriptContext_local->super_ScriptContextBase).isClosed;
          iVar5 = (*(pJVar10->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
                    super_FinalizableObject.super_IRecyclerVisitedObject.
                    _vptr_IRecyclerVisitedObject[0x66])(pJVar10);
          if ((iVar5 != 0) || (bVar4 = IsFillFromPrototypes(pJVar10), bVar4)) {
            iVar5 = 5;
            SpreadArrayArgs::anon_class_16_2_4d2d011e::operator()
                      ((anon_class_16_2_4d2d011e *)local_a8,this_00,local_34,srcArray,(uint)local_48
                       ,end);
            goto LAB_00b938ce;
          }
        }
        *(bool *)&needArraySlowCopy.jsReentLock[8].m_arrayObject = bVar1;
        CopyAnyArrayElementsToVar<unsigned_int>(this_00,local_34,srcArray,(uint)local_48,end);
        JsReentLock::MutateArrayObject((JsReentLock *)&needArraySlowCopy);
        *(undefined1 *)&needArraySlowCopy.jsReentLock[8].m_arrayObject = 1;
        iVar5 = 5;
      }
      else {
        *(bool *)&needArraySlowCopy.jsReentLock[8].m_arrayObject = bVar1;
        iVar5 = (*(srcArray->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
                  super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
                  [0x72])(srcArray,local_48);
        pvVar8 = (Var)CONCAT44(extraout_var_00,iVar5);
        JsReentLock::MutateArrayObject((JsReentLock *)&needArraySlowCopy);
        *(undefined1 *)&needArraySlowCopy.jsReentLock[8].m_arrayObject = 1;
        bVar4 = VarIs<Js::SpreadArgument>(pvVar8);
        if (bVar4) {
          pSVar11 = VarTo<Js::SpreadArgument>(pvVar8);
          pLVar2 = (pSVar11->iteratorIndices).ptr;
          if (pLVar2 == (List<void_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                         *)0x0) {
            uVar13 = 0;
            pWVar12 = (WriteBarrierPtr<void> *)0x0;
          }
          else {
            uVar13 = (pLVar2->super_ReadOnlyList<void_*,_Memory::Recycler,_DefaultComparer>).count;
            pWVar12 = (pLVar2->super_ReadOnlyList<void_*,_Memory::Recycler,_DefaultComparer>).buffer
                      .ptr;
          }
          spreadIndices = (AuxArray<unsigned_int> *)slowCopy.needArraySlowCopy;
          if (uVar13 != 0) {
            uVar14 = 0;
            do {
              DirectSetItemAt<void*>(this_00,local_34 + (int)uVar14,pWVar12[uVar14].ptr);
              uVar14 = uVar14 + 1;
            } while (uVar13 != uVar14);
            local_34 = local_34 + (int)uVar14;
            spreadIndices = (AuxArray<unsigned_int> *)slowCopy.needArraySlowCopy;
          }
        }
        else {
          BVar7 = JavascriptOperators::IsUndefinedObject(pvVar8);
          if (BVar7 == 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar9 = 1;
            bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                        ,0x2e0a,"(JavascriptOperators::IsUndefinedObject(instance))"
                                        ,"JavascriptOperators::IsUndefinedObject(instance)");
            if (!bVar4) goto LAB_00b93973;
            *puVar9 = 0;
          }
          DirectSetItemAt<void*>(this_00,local_34,pvVar8);
          local_34 = local_34 + 1;
        }
        local_4c = local_4c +
                   (local_4c <
                   *(uint32 *)&((anon_class_8_1_9014563a *)spreadIndices)->jsReentLock - 1);
        iVar5 = 0;
      }
LAB_00b938ce:
    } while ((((iVar5 == 7) || (iVar5 == 0)) &&
             (uVar13 = (int)local_48 + 1, local_48 = (ScriptContext *)(ulong)uVar13, uVar13 < end))
            && (local_34 < elementCount));
  }
  if (end != (srcArray->super_ArrayObject).length) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x2e14,"(arrayLength == array->GetLength())",
                                "Array\'s length should not have changed");
    if (!bVar4) {
LAB_00b93973:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar9 = 0;
  }
  *(bool *)&needArraySlowCopy.jsReentLock[8].m_arrayObject = bVar1;
  return this_00;
}

Assistant:

Var JavascriptArray::SpreadArrayArgs(Var arrayToSpread, const Js::AuxArray<uint32> *spreadIndices, ScriptContext *scriptContext)
    {
        JS_REENTRANCY_LOCK(jsReentLock, scriptContext->GetThreadContext());
        SETOBJECT_FOR_MUTATION(jsReentLock, arrayToSpread);

        // At this stage we have an array literal with some arguments to be spread.
        // First we need to calculate the real size of the final literal.
#if ENABLE_COPYONACCESS_ARRAY
        JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<Var>(arrayToSpread);
#endif
        JavascriptArray *array = VarTo<JavascriptArray>(arrayToSpread);
        uint32 arrayLength = array->GetLength();
        uint32 actualLength = arrayLength;

        for (unsigned i = 0; i < spreadIndices->count; ++i)
        {
            JS_REENTRANT(jsReentLock,
                actualLength = UInt32Math::Add(actualLength - 1, GetSpreadArgLen(array->DirectGetItem(spreadIndices->elements[i]), scriptContext)));
        }

        JavascriptArray *result = VarTo<JavascriptArray>(OP_NewScArrayWithMissingValues(actualLength, scriptContext));

        // Now we copy each element and expand the spread parameters inline.
        for (unsigned i = 0, spreadArrIndex = 0, resultIndex = 0; i < arrayLength && resultIndex < actualLength; ++i)
        {
            uint32 spreadIndex = spreadIndices->elements[spreadArrIndex]; // The index of the next element to be spread.

            // An array needs a slow copy if it is a cross-site object or we have missing values that need to be set to undefined.
            auto needArraySlowCopy = [&](Var instance) {
                JavascriptArray *arr = JavascriptArray::TryVarToNonES5Array(instance);
                if (arr)
                {
                    JS_REENTRANT_UNLOCK(jsReentLock, return arr->IsCrossSiteObject() || arr->IsFillFromPrototypes());
                }
                return false;
            };

            // Designed to have interchangeable arguments with CopyAnyArrayElementsToVar.
            auto slowCopy = [&scriptContext, &needArraySlowCopy
                ](JavascriptArray *dstArray, unsigned dstIndex, Var srcArray, uint32 start, uint32 end) {
                Assert(needArraySlowCopy(srcArray) || VarIs<ArgumentsObject>(srcArray) || VarIs<TypedArrayBase>(srcArray) || VarIs<JavascriptString>(srcArray));
                JS_REENTRANCY_LOCK(jsReentLock, scriptContext->GetThreadContext());

                RecyclableObject *propertyObject;
                if (!JavascriptOperators::GetPropertyObject(srcArray, scriptContext, &propertyObject))
                {
                    JavascriptError::ThrowTypeError(scriptContext, JSERR_InvalidSpreadArgument);
                }

                for (uint32 j = start; j < end; j++)
                {
                    Var element;
                    JS_REENTRANT(jsReentLock, BOOL gotItem = JavascriptOperators::GetItem(srcArray, propertyObject, j, &element, scriptContext));
                    if (!gotItem)
                    {
                        // skip elided elements
                        dstIndex++;
                    }
                    else
                    {
                        dstArray->DirectSetItemAt(dstIndex++, element);
                    }
                }
            };

            if (i < spreadIndex)
            {
                // Any non-spread elements can be copied in bulk.

                if (needArraySlowCopy(array))
                {
                    slowCopy(result, resultIndex, (Var)array, i, spreadIndex);
                }
                else
                {
                    JS_REENTRANT(jsReentLock, CopyAnyArrayElementsToVar(result, resultIndex, array, i, spreadIndex));
                }
                resultIndex += spreadIndex - i;
                i = spreadIndex - 1;
                continue;
            }
            else if (i > spreadIndex)
            {
                // Any non-spread elements terminating the array can also be copied in bulk.
                Assert(spreadArrIndex == spreadIndices->count - 1);
                if (needArraySlowCopy(array))
                {
                    slowCopy(result, resultIndex, array, i, arrayLength);
                }
                else
                {
                    JS_REENTRANT(jsReentLock, CopyAnyArrayElementsToVar(result, resultIndex, array, i, arrayLength));
                }
                break;
            }
            else
            {
                JS_REENTRANT(jsReentLock, Var instance = array->DirectGetItem(i));

                if (VarIs<SpreadArgument>(instance))
                {
                    SpreadArgument* spreadArgument = VarTo<SpreadArgument>(instance);
                    uint32 len = spreadArgument->GetArgumentSpreadCount();
                    const Var*  spreadItems = spreadArgument->GetArgumentSpread();
                    for (uint32 j = 0; j < len; j++)
                    {
                        result->DirectSetItemAt(resultIndex++, spreadItems[j]);
                    }

                }
                else
                {
                    Assert(JavascriptOperators::IsUndefinedObject(instance));
                    result->DirectSetItemAt(resultIndex++, instance);
                }

                if (spreadArrIndex < spreadIndices->count - 1)
                {
                    spreadArrIndex++;
                }
            }
        }
        AssertMsg(arrayLength == array->GetLength(), "Array's length should not have changed");
        return result;
    }